

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

void FAudio_INTERNAL_FreeEffectChain(FAudioVoice *voice)

{
  long *in_RDI;
  uint32_t i;
  uint local_c;
  
  if (*(int *)((long)in_RDI + 0x4c) != 0) {
    for (local_c = 0; local_c < *(uint *)((long)in_RDI + 0x4c); local_c = local_c + 1) {
      (**(code **)(*(long *)(in_RDI[10] + (ulong)local_c * 0x10) + 0x40))
                (*(undefined8 *)(in_RDI[10] + (ulong)local_c * 0x10));
      (**(code **)(*(long *)(in_RDI[10] + (ulong)local_c * 0x10) + 8))
                (*(undefined8 *)(in_RDI[10] + (ulong)local_c * 0x10));
    }
    (**(code **)(*in_RDI + 0xc0))(in_RDI[10]);
    (**(code **)(*in_RDI + 0xc0))(in_RDI[0xb]);
    (**(code **)(*in_RDI + 0xc0))(in_RDI[0xc]);
    (**(code **)(*in_RDI + 0xc0))(in_RDI[0xd]);
    (**(code **)(*in_RDI + 0xc0))(in_RDI[0xe]);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_FreeEffectChain(FAudioVoice *voice)
{
	uint32_t i;

	LOG_FUNC_ENTER(voice->audio)
	if (voice->effects.count == 0)
	{
		LOG_FUNC_EXIT(voice->audio)
		return;
	}

	for (i = 0; i < voice->effects.count; i += 1)
	{
		voice->effects.desc[i].pEffect->UnlockForProcess(voice->effects.desc[i].pEffect);
		voice->effects.desc[i].pEffect->Release(voice->effects.desc[i].pEffect);
	}

	voice->audio->pFree(voice->effects.desc);
	voice->audio->pFree(voice->effects.parameters);
	voice->audio->pFree(voice->effects.parameterSizes);
	voice->audio->pFree(voice->effects.parameterUpdates);
	voice->audio->pFree(voice->effects.inPlaceProcessing);
	LOG_FUNC_EXIT(voice->audio)
}